

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O3

void Abc_NtkTestMiniMapping(Abc_Ntk_t *p)

{
  int *pArray;
  Vec_Int_t *__ptr;
  
  __ptr = Abc_NtkWriteMiniMapping(p);
  pArray = __ptr->pArray;
  Abc_NtkPrintMiniMapping(pArray);
  printf("Array has size %d ints.\n",(ulong)(uint)__ptr->nSize);
  if (pArray != (int *)0x0) {
    free(pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkTestMiniMapping( Abc_Ntk_t * p )
{
    Vec_Int_t * vMapping;
    vMapping = Abc_NtkWriteMiniMapping( p );
    Abc_NtkPrintMiniMapping( Vec_IntArray(vMapping) );
    printf( "Array has size %d ints.\n", Vec_IntSize(vMapping) );
    Vec_IntFree( vMapping );
}